

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dukvalue.h
# Opt level: O1

string * __thiscall DukValue::as_string_abi_cxx11_(DukValue *this)

{
  DukException *this_00;
  DukException *pDVar1;
  byte bVar2;
  char *rhs;
  undefined **local_48;
  _Alloc_hider _Stack_40;
  size_type local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_30;
  
  if (this->mType == STRING) {
    return &this->mString;
  }
  this_00 = (DukException *)__cxa_allocate_exception(0x28);
  _Stack_40._M_p = (pointer)&aStack_30;
  aStack_30._8_8_ = 0;
  local_48 = &PTR__DukException_0016b6b8;
  local_38 = 0;
  aStack_30._M_allocated_capacity = 0;
  pDVar1 = DukException::operator<<((DukException *)&local_48,"Expected string, got ");
  bVar2 = this->mType - UNDEFINED;
  if (bVar2 < 9) {
    rhs = *(char **)(&DAT_0016b760 + (ulong)bVar2 * 8);
  }
  else {
    rhs = "?";
  }
  pDVar1 = DukException::operator<<(pDVar1,rhs);
  DukException::DukException(this_00,pDVar1);
  __cxa_throw(this_00,&DukException::typeinfo,DukException::~DukException);
}

Assistant:

inline const std::string& as_string() const {
		if (mType != STRING)
			throw DukException() << "Expected string, got " << type_name();
		return mString;
	}